

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O3

void __thiscall leveldb::Benchmark::Benchmark(Benchmark *this)

{
  size_type *psVar1;
  Env **ppEVar2;
  int *piVar3;
  int iVar4;
  long *plVar5;
  Cache *pCVar6;
  FilterPolicy *pFVar7;
  long *plVar8;
  long *plVar9;
  pointer pbVar10;
  pointer pbVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  allocator local_109;
  string local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  void *local_c8;
  void *local_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  void *local_98;
  Options local_90;
  
  if ((long)FLAGS_cache_size < 0) {
    pCVar6 = (Cache *)0x0;
  }
  else {
    pCVar6 = NewLRUCache((long)FLAGS_cache_size);
  }
  this->cache_ = pCVar6;
  if (FLAGS_bloom_bits < 0) {
    pFVar7 = (FilterPolicy *)0x0;
  }
  else {
    pFVar7 = NewBloomFilterPolicy(FLAGS_bloom_bits);
  }
  this->filter_policy_ = pFVar7;
  this->db_ = (DB *)0x0;
  iVar4 = FLAGS_num;
  this->num_ = FLAGS_num;
  this->value_size_ = FLAGS_value_size;
  this->entries_per_batch_ = 1;
  (this->write_options_).sync = false;
  iVar12 = FLAGS_reads;
  if (FLAGS_reads < 0) {
    iVar12 = iVar4;
  }
  this->reads_ = iVar12;
  this->heap_counter_ = 0;
  plVar5 = (anonymous_namespace)::g_env;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_90,FLAGS_db,(allocator *)&local_108);
  (**(code **)(*plVar5 + 0x38))(&local_98,plVar5,&local_90,&local_e8);
  if (local_98 != (void *)0x0) {
    operator_delete__(local_98);
  }
  ppEVar2 = &local_90.env;
  if (local_90.comparator != (Comparator *)ppEVar2) {
    operator_delete(local_90.comparator);
  }
  if (local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar14 = 8;
    uVar13 = 0;
    pbVar10 = local_e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar11 = local_e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    do {
      plVar5 = (anonymous_namespace)::g_env;
      if ((4 < *(ulong *)((long)&(pbVar10->_M_dataplus)._M_p + lVar14)) &&
         (piVar3 = *(int **)((long)pbVar10 + lVar14 + -8),
         (char)piVar3[1] == '-' && *piVar3 == 0x70616568)) {
        std::__cxx11::string::string((string *)local_b8,FLAGS_db,&local_109);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_b8);
        psVar1 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_108.field_2._M_allocated_capacity = *psVar1;
          local_108.field_2._8_8_ = plVar8[3];
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        }
        else {
          local_108.field_2._M_allocated_capacity = *psVar1;
          local_108._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_108._M_string_length = plVar8[1];
        *plVar8 = (long)psVar1;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_108,
                                    *(ulong *)((long)local_e8.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                              lVar14 + -8));
        plVar8 = plVar9 + 2;
        if ((Env **)*plVar9 == (Env **)plVar8) {
          local_90.env = (Env *)*plVar8;
          local_90.info_log._0_4_ = (undefined4)plVar9[3];
          local_90.info_log._4_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
          local_90.comparator = (Comparator *)ppEVar2;
        }
        else {
          local_90.env = (Env *)*plVar8;
          local_90.comparator = (Comparator *)*plVar9;
        }
        local_90._8_8_ = plVar9[1];
        *plVar9 = (long)plVar8;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        (**(code **)(*plVar5 + 0x40))(&local_c8,plVar5,&local_90);
        if (local_c8 != (void *)0x0) {
          operator_delete__(local_c8);
        }
        if (local_90.comparator != (Comparator *)ppEVar2) {
          operator_delete(local_90.comparator);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        pbVar10 = local_e8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar11 = local_e8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0]);
          pbVar10 = local_e8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar11 = local_e8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      uVar13 = uVar13 + 1;
      lVar14 = lVar14 + 0x20;
    } while (uVar13 < (ulong)((long)pbVar11 - (long)pbVar10 >> 5));
  }
  if (FLAGS_use_existing_db == false) {
    std::__cxx11::string::string((string *)&local_108,FLAGS_db,(allocator *)local_b8);
    Options::Options(&local_90);
    DestroyDB((leveldb *)&local_c0,&local_108,&local_90);
    if (local_c0 != (void *)0x0) {
      operator_delete__(local_c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  return;
}

Assistant:

Benchmark()
      : cache_(FLAGS_cache_size >= 0 ? NewLRUCache(FLAGS_cache_size) : nullptr),
        filter_policy_(FLAGS_bloom_bits >= 0
                           ? NewBloomFilterPolicy(FLAGS_bloom_bits)
                           : nullptr),
        db_(nullptr),
        num_(FLAGS_num),
        value_size_(FLAGS_value_size),
        entries_per_batch_(1),
        reads_(FLAGS_reads < 0 ? FLAGS_num : FLAGS_reads),
        heap_counter_(0) {
    std::vector<std::string> files;
    g_env->GetChildren(FLAGS_db, &files);
    for (size_t i = 0; i < files.size(); i++) {
      if (Slice(files[i]).starts_with("heap-")) {
        g_env->RemoveFile(std::string(FLAGS_db) + "/" + files[i]);
      }
    }
    if (!FLAGS_use_existing_db) {
      DestroyDB(FLAGS_db, Options());
    }
  }